

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O3

const_iterator __thiscall
frozen::set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_>::find<char[2]>
          (set<frozen::basic_string<char>,_3UL,_std::less<frozen::basic_string<char>_>_> *this,
          char (*key) [2])

{
  const_iterator pvVar1;
  
  pvVar1 = lower_bound<char[2]>(this,key);
  if (pvVar1 != (const_iterator)(this + 1)) {
    if (pvVar1->size_ == 0) {
      return pvVar1;
    }
    if ((*pvVar1->data_ <= (*key)[0]) && (pvVar1->size_ == 1 || *pvVar1->data_ < (*key)[0])) {
      return pvVar1;
    }
  }
  return (const_iterator)(this + 1);
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }